

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void TTD::RuntimeContextInfo::LoadAndOrderPropertyNames
               (RecyclableObject *obj,
               List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *propertyList)

{
  ScriptContext *this;
  int iVar1;
  BOOL BVar2;
  Type *ppPVar3;
  bool bVar4;
  bool local_91;
  Type local_80;
  PropertyRecord *shiftElem;
  Type pPStack_70;
  int32 j;
  PropertyRecord *temp;
  int32 i_1;
  int32 gap;
  uint32 gapi;
  int32 llen;
  int32 gaps [6];
  PropertyRecord *local_38;
  uint local_30;
  ushort local_2a;
  PropertyId propertyId;
  uint uStack_24;
  PropertyIndex propertyIndex;
  uint32 i;
  uint32 propcount;
  ScriptContext *ctx;
  List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *propertyList_local;
  RecyclableObject *obj_local;
  
  ctx = (ScriptContext *)propertyList;
  propertyList_local =
       (List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)obj;
  iVar1 = JsUtil::ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>::
          Count(&propertyList->
                 super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
               );
  if (iVar1 != 0) {
    TTDAbort_unrecoverable_error("This should be empty.");
  }
  _i = Js::RecyclableObject::GetScriptContext((RecyclableObject *)propertyList_local);
  uStack_24 = (*(propertyList_local->
                super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                )._vptr_ReadOnlyList[10])();
  propertyId = 0;
  do {
    if (uStack_24 <= (uint)propertyId) {
      _gapi = 0x3900000084;
      gaps[0] = 0x17;
      gaps[1] = 10;
      gaps[2] = 4;
      gaps[3] = 1;
      gap = JsUtil::ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
            ::Count((ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                     *)ctx);
      for (i_1 = 0; (uint)i_1 < 6; i_1 = i_1 + 1) {
        temp._0_4_ = (&gapi)[(uint)i_1];
        temp._4_4_ = (uint32)temp;
        for (; (int)(uint32)temp < gap; temp._0_4_ = (uint32)temp + 1) {
          ppPVar3 = JsUtil::
                    List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)ctx,(uint32)temp);
          pPStack_70 = *ppPVar3;
          shiftElem._4_4_ = (uint32)temp;
          while( true ) {
            local_91 = false;
            if ((int)temp._4_4_ <= (int)shiftElem._4_4_) {
              ppPVar3 = JsUtil::
                        List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        ::Item((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                *)ctx,shiftElem._4_4_ - temp._4_4_);
              local_91 = PropertyNameCmp(*ppPVar3,pPStack_70);
            }
            if (local_91 == false) break;
            ppPVar3 = JsUtil::
                      List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                              *)ctx,shiftElem._4_4_ - temp._4_4_);
            local_80 = *ppPVar3;
            JsUtil::
            List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::SetItem((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)ctx,shiftElem._4_4_,&local_80);
            shiftElem._4_4_ = shiftElem._4_4_ - temp._4_4_;
          }
          JsUtil::
          List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::SetItem((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)ctx,shiftElem._4_4_,&stack0xffffffffffffff90);
        }
      }
      return;
    }
    local_2a = (ushort)propertyId;
    local_30 = (*(propertyList_local->
                 super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                 )._vptr_ReadOnlyList[7])(propertyList_local,(ulong)local_2a);
    bVar4 = local_30 != 0xffffffff;
    BVar2 = Js::IsInternalPropertyId(local_30);
    if (bVar4 && BVar2 == 0) {
      iVar1 = (*(propertyList_local->
                super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                )._vptr_ReadOnlyList[0xc])(propertyList_local,(ulong)local_30);
      this = ctx;
      if (iVar1 == 0) {
        TTDAbort_unrecoverable_error("We are assuming this is own property count.");
      }
      local_38 = Js::ScriptContext::GetPropertyName(_i,local_30);
      JsUtil::
      List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)this,&local_38);
    }
    propertyId = propertyId + 1;
  } while( true );
}

Assistant:

void RuntimeContextInfo::LoadAndOrderPropertyNames(Js::RecyclableObject* obj, JsUtil::List<const Js::PropertyRecord*, HeapAllocator>& propertyList)
    {
        TTDAssert(propertyList.Count() == 0, "This should be empty.");

        Js::ScriptContext* ctx = obj->GetScriptContext();
        uint32 propcount = (uint32)obj->GetPropertyCount();

        //get all of the properties
        for(uint32 i = 0; i < propcount; ++i)
        {
            Js::PropertyIndex propertyIndex = (Js::PropertyIndex)i;
            Js::PropertyId propertyId = obj->GetPropertyId(propertyIndex);

            if((propertyId != Js::Constants::NoProperty) & (!Js::IsInternalPropertyId(propertyId)))
            {
                TTDAssert(obj->HasOwnProperty(propertyId), "We are assuming this is own property count.");

                propertyList.Add(ctx->GetPropertyName(propertyId));
            }
        }

        //now sort the list so the traversal order is stable
        //Rock a custom shell sort!!!!
        const int32 gaps[6] = { 132, 57, 23, 10, 4, 1 };

        int32 llen = propertyList.Count();
        for(uint32 gapi = 0; gapi < 6; ++gapi)
        {
            int32 gap = gaps[gapi];

            for(int32 i = gap; i < llen; i++)
            {
                const Js::PropertyRecord* temp = propertyList.Item(i);

                int32 j = 0;
                for(j = i; j >= gap && PropertyNameCmp(propertyList.Item(j - gap), temp); j -= gap)
                {
                    const Js::PropertyRecord* shiftElem = propertyList.Item(j - gap);
                    propertyList.SetItem(j, shiftElem);
                }

                propertyList.SetItem(j, temp);
            }
        }
    }